

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

uint16 ecx_siiSMnext(ecx_contextt *context,uint16 slave,ec_eepromSMt *SM,uint16 n)

{
  uint8 uVar1;
  bool bVar2;
  byte bVar3;
  uint8 uVar4;
  undefined6 in_register_00000032;
  short sVar5;
  
  uVar1 = context->slavelist[CONCAT62(in_register_00000032,slave) & 0xffffffff].eep_pdi;
  bVar2 = n < SM->nSM;
  if (bVar2) {
    sVar5 = n * 8 + SM->Startpos;
    bVar3 = ecx_siigetbyte(context,slave,sVar5 + 2);
    SM->PhStart = (ushort)bVar3;
    bVar3 = ecx_siigetbyte(context,slave,sVar5 + 3);
    SM->PhStart = SM->PhStart + (ushort)bVar3 * 0x100;
    bVar3 = ecx_siigetbyte(context,slave,sVar5 + 4);
    SM->Plength = (ushort)bVar3;
    bVar3 = ecx_siigetbyte(context,slave,sVar5 + 5);
    SM->Plength = SM->Plength + (ushort)bVar3 * 0x100;
    uVar4 = ecx_siigetbyte(context,slave,sVar5 + 6);
    SM->Creg = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,sVar5 + 7);
    SM->Sreg = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,sVar5 + 8);
    SM->Activate = uVar4;
    uVar4 = ecx_siigetbyte(context,slave,sVar5 + 9);
    SM->PDIctrl = uVar4;
  }
  if (uVar1 != '\0') {
    ecx_eeprom2pdi(context,slave);
  }
  return (uint16)bVar2;
}

Assistant:

uint16 ecx_siiSMnext(ecx_contextt *context, uint16 slave, ec_eepromSMt* SM, uint16 n)
{
   uint16 a;
   uint16 retVal = 0;
   uint8 eectl = context->slavelist[slave].eep_pdi;

   if (n < SM->nSM)
   {
      a = SM->Startpos + 2 + (n * 8);
      SM->PhStart = ecx_siigetbyte(context, slave, a++);
      SM->PhStart += (ecx_siigetbyte(context, slave, a++) << 8);
      SM->Plength = ecx_siigetbyte(context, slave, a++);
      SM->Plength += (ecx_siigetbyte(context, slave, a++) << 8);
      SM->Creg = ecx_siigetbyte(context, slave, a++);
      SM->Sreg = ecx_siigetbyte(context, slave, a++);
      SM->Activate = ecx_siigetbyte(context, slave, a++);
      SM->PDIctrl = ecx_siigetbyte(context, slave, a++);
      retVal = 1;
   }
   if (eectl)
   {
      ecx_eeprom2pdi(context, slave); /* if eeprom control was previously pdi then restore */
   }

   return retVal;
}